

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::set_required<std::__cxx11::string>
          (Parser *this,string *name,string *alternative,string *description,bool dominant)

{
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  this_00 = (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0xd0);
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CmdArgument(this_00,name,alternative,description,true,dominant);
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,(CmdBase **)&local_38);
  return;
}

Assistant:

void set_required(const std::string& name, const std::string& alternative, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, true, dominant };
			_commands.push_back(command);
		}